

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

Ch __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
::TakePush(NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
           *this)

{
  SizeType *pSVar1;
  MemoryStream *pMVar2;
  Ch *pCVar3;
  Ch CVar4;
  char *pcVar5;
  char cVar6;
  
  pMVar2 = ((this->
            super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
            ).is)->is_;
  pcVar5 = pMVar2->src_;
  if (pcVar5 == pMVar2->end_) {
    cVar6 = '\0';
  }
  else {
    cVar6 = *pcVar5;
  }
  pcVar5 = internal::Stack<rapidjson::CrtAllocator>::Push<char>((this->stackStream).stack_,1);
  *pcVar5 = cVar6;
  pSVar1 = &(this->stackStream).length_;
  *pSVar1 = *pSVar1 + 1;
  pMVar2 = ((this->
            super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
            ).is)->is_;
  pCVar3 = pMVar2->src_;
  if (pCVar3 == pMVar2->end_) {
    CVar4 = '\0';
  }
  else {
    pMVar2->src_ = pCVar3 + 1;
    CVar4 = *pCVar3;
  }
  return CVar4;
}

Assistant:

RAPIDJSON_FORCEINLINE Ch TakePush() {
            stackStream.Put(static_cast<char>(Base::is.Peek()));
            return Base::is.Take();
        }